

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O1

void __thiscall FIX::SocketAcceptor::onConnect(SocketAcceptor *this)

{
  socket_handle in_ECX;
  socket_handle in_EDX;
  SocketServer *in_RSI;
  
  onConnect((SocketAcceptor *)
            ((long)&this[-1].super_Acceptor.m_settings.m_settings._M_t._M_impl.super__Rb_tree_header
                    ._M_header + 0x18),in_RSI,in_EDX,in_ECX);
  return;
}

Assistant:

void SocketAcceptor::onConnect(SocketServer &server, socket_handle a, socket_handle s) {
  if (!socket_isValid(s)) {
    return;
  }
  SocketConnections::iterator i = m_connections.find(s);
  if (i != m_connections.end()) {
    return;
  }
  uint16_t port = server.socketToPort(a);
  Sessions sessions = m_portToSessions[port];
  m_connections[s] = new SocketConnection(s, sessions, &server.getMonitor());

  std::stringstream stream;
  stream << "Accepted connection from " << socket_peername(s) << " on port " << port;

  if (getLog()) {
    getLog()->onEvent(stream.str());
  }
}